

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

bool __thiscall kratos::Context::is_unique(Context *this,Generator *gen)

{
  bool bVar1;
  mapped_type *this_00;
  __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  shared_ptr<kratos::Generator> *g;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  uint64_t c;
  mapped_type *gens;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
  local_28;
  Generator *local_20;
  Generator *gen_local;
  Context *this_local;
  
  if (gen == (Generator *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = gen;
    gen_local = (Generator *)this;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
         ::find(&this->modules_,&gen->name);
    gens = (mapped_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
           ::end(&this->modules_);
    bVar1 = std::__detail::operator==
                      (&local_28,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                        *)&gens);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
                ::at(&this->modules_,&local_20->name);
      __range1 = (mapped_type *)0x0;
      __end1 = std::
               set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ::begin(this_00);
      g = (shared_ptr<kratos::Generator> *)
          std::
          set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::end(this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end1,(_Self *)&g);
        if (!bVar1) break;
        this_01 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator*
                               (&__end1);
        peVar2 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        bVar1 = Generator::external(peVar2);
        if (!bVar1) {
          peVar2 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          bVar1 = Generator::is_cloned(peVar2);
          if (!bVar1) {
            __range1 = (mapped_type *)&(__range1->_M_t)._M_impl.field_0x1;
          }
        }
        std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator++(&__end1);
      }
      this_local._7_1_ = __range1 == (mapped_type *)0x1;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Context::is_unique(kratos::Generator *gen) const {
    if (gen == nullptr) return false;
    if (modules_.find(gen->name) == modules_.end()) return false;
    auto const &gens = modules_.at(gen->name);
    uint64_t c = 0;
    for (auto const &g : gens) {
        if (!g->external() && !g->is_cloned()) {
            c++;
        }
    }
    return c == 1;
}